

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

void __thiscall cmCTestScriptHandler::UpdateElapsedTime(cmCTestScriptHandler *this)

{
  cmMakefile *this_00;
  uint __val;
  long lVar1;
  string timeString;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if (this->Makefile != (cmMakefile *)0x0) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    local_48._M_dataplus._M_p =
         (pointer)((double)(lVar1 - (this->ScriptStartTime).__d.__r) / 1000000000.0);
    __val = cmDurationTo<unsigned_int>((cmDuration *)&local_48);
    std::__cxx11::to_string(&local_48,__val);
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"CTEST_ELAPSED_TIME",&local_49);
    cmMakefile::AddDefinition(this_00,&local_28,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void cmCTestScriptHandler::UpdateElapsedTime()
{
  if (this->Makefile) {
    // set the current elapsed time
    auto itime = cmDurationTo<unsigned int>(std::chrono::steady_clock::now() -
                                            this->ScriptStartTime);
    auto timeString = std::to_string(itime);
    this->Makefile->AddDefinition("CTEST_ELAPSED_TIME", timeString.c_str());
  }
}